

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_mul_comb(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
                _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  byte t_len;
  int iVar1;
  ulong d_00;
  bool bVar2;
  mbedtls_ecp_point *local_1b0;
  undefined1 local_1a0 [8];
  mbedtls_mpi mm;
  mbedtls_mpi M;
  mbedtls_ecp_point *T;
  uchar k [262];
  size_t d;
  byte local_45;
  int iStack_44;
  uchar i;
  uchar pre_len;
  uchar p_eq_g;
  uchar m_is_odd;
  uchar w;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_ecp_point *P_local;
  mbedtls_mpi *m_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)&mm.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_1a0);
  iVar1 = mbedtls_mpi_get_bit(&grp->N,0);
  if (iVar1 != 1) {
    return -0x4f80;
  }
  local_45 = 4;
  if (0x17f < grp->nbits) {
    local_45 = 5;
  }
  iVar1 = mbedtls_mpi_cmp_mpi(&P->Y,&(grp->G).Y);
  bVar2 = false;
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_cmp_mpi(&P->X,&(grp->G).X);
    bVar2 = iVar1 == 0;
  }
  if (bVar2) {
    local_45 = local_45 + 1;
  }
  if (6 < local_45) {
    local_45 = 6;
  }
  if (grp->nbits <= (ulong)local_45) {
    local_45 = 2;
  }
  t_len = (byte)(1 << (local_45 - 1 & 0x1f));
  d_00 = ((grp->nbits + (ulong)local_45) - 1) / (ulong)local_45;
  if (bVar2) {
    local_1b0 = grp->T;
  }
  else {
    local_1b0 = (mbedtls_ecp_point *)0x0;
  }
  M.p = (mbedtls_mpi_uint *)local_1b0;
  if (local_1b0 == (mbedtls_ecp_point *)0x0) {
    M.p = (mbedtls_mpi_uint *)calloc((ulong)t_len,0x48);
    if ((mbedtls_ecp_point *)M.p == (mbedtls_ecp_point *)0x0) {
      iStack_44 = -0x4d80;
      goto LAB_00191075;
    }
    iStack_44 = ecp_precompute_comb(grp,(mbedtls_ecp_point *)M.p,P,local_45,d_00);
    if (iStack_44 != 0) goto LAB_00191075;
    if (bVar2) {
      grp->T = (mbedtls_ecp_point *)M.p;
      grp->T_size = (ulong)t_len;
    }
  }
  iVar1 = mbedtls_mpi_get_bit(m,0);
  iStack_44 = mbedtls_mpi_copy((mbedtls_mpi *)&mm.p,m);
  if (((iStack_44 == 0) &&
      (iStack_44 = mbedtls_mpi_sub_mpi((mbedtls_mpi *)local_1a0,&grp->N,m), iStack_44 == 0)) &&
     (iStack_44 = mbedtls_mpi_safe_cond_assign
                            ((mbedtls_mpi *)&mm.p,(mbedtls_mpi *)local_1a0,(iVar1 == 1 ^ 0xffU) & 1)
     , iStack_44 == 0)) {
    ecp_comb_fixed((uchar *)&T,d_00,local_45,(mbedtls_mpi *)&mm.p);
    iStack_44 = ecp_mul_comb_core(grp,R,(mbedtls_ecp_point *)M.p,t_len,(uchar *)&T,d_00,f_rng,p_rng)
    ;
    if ((iStack_44 == 0) &&
       (iStack_44 = ecp_safe_invert_jac(grp,R,(iVar1 == 1 ^ 0xffU) & 1), iStack_44 == 0)) {
      iStack_44 = ecp_normalize_jac(grp,R);
    }
  }
LAB_00191075:
  if ((M.p != (mbedtls_mpi_uint *)0x0) && (!bVar2)) {
    for (d._7_1_ = 0; d._7_1_ < t_len; d._7_1_ = d._7_1_ + 1) {
      mbedtls_ecp_point_free((mbedtls_ecp_point *)(M.p + (ulong)d._7_1_ * 9));
    }
    free(M.p);
  }
  mbedtls_mpi_free((mbedtls_mpi *)&mm.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_1a0);
  if (iStack_44 != 0) {
    mbedtls_ecp_point_free(R);
  }
  return iStack_44;
}

Assistant:

static int ecp_mul_comb( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                         const mbedtls_mpi *m, const mbedtls_ecp_point *P,
                         int (*f_rng)(void *, unsigned char *, size_t),
                         void *p_rng )
{
    int ret;
    unsigned char w, m_is_odd, p_eq_g, pre_len, i;
    size_t d;
    unsigned char k[COMB_MAX_D + 1];
    mbedtls_ecp_point *T;
    mbedtls_mpi M, mm;

    mbedtls_mpi_init( &M );
    mbedtls_mpi_init( &mm );

    /* we need N to be odd to trnaform m in an odd number, check now */
    if( mbedtls_mpi_get_bit( &grp->N, 0 ) != 1 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * Minimize the number of multiplications, that is minimize
     * 10 * d * w + 18 * 2^(w-1) + 11 * d + 7 * w, with d = ceil( nbits / w )
     * (see costs of the various parts, with 1S = 1M)
     */
    w = grp->nbits >= 384 ? 5 : 4;

    /*
     * If P == G, pre-compute a bit more, since this may be re-used later.
     * Just adding one avoids upping the cost of the first mul too much,
     * and the memory cost too.
     */
#if MBEDTLS_ECP_FIXED_POINT_OPTIM == 1
    p_eq_g = ( mbedtls_mpi_cmp_mpi( &P->Y, &grp->G.Y ) == 0 &&
               mbedtls_mpi_cmp_mpi( &P->X, &grp->G.X ) == 0 );
    if( p_eq_g )
        w++;
#else
    p_eq_g = 0;
#endif

    /*
     * Make sure w is within bounds.
     * (The last test is useful only for very small curves in the test suite.)
     */
    if( w > MBEDTLS_ECP_WINDOW_SIZE )
        w = MBEDTLS_ECP_WINDOW_SIZE;
    if( w >= grp->nbits )
        w = 2;

    /* Other sizes that depend on w */
    pre_len = 1U << ( w - 1 );
    d = ( grp->nbits + w - 1 ) / w;

    /*
     * Prepare precomputed points: if P == G we want to
     * use grp->T if already initialized, or initialize it.
     */
    T = p_eq_g ? grp->T : NULL;

    if( T == NULL )
    {
        T = mbedtls_calloc( pre_len, sizeof( mbedtls_ecp_point ) );
        if( T == NULL )
        {
            ret = MBEDTLS_ERR_ECP_ALLOC_FAILED;
            goto cleanup;
        }

        MBEDTLS_MPI_CHK( ecp_precompute_comb( grp, T, P, w, d ) );

        if( p_eq_g )
        {
            grp->T = T;
            grp->T_size = pre_len;
        }
    }

    /*
     * Make sure M is odd (M = m or M = N - m, since N is odd)
     * using the fact that m * P = - (N - m) * P
     */
    m_is_odd = ( mbedtls_mpi_get_bit( m, 0 ) == 1 );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &M, m ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &mm, &grp->N, m ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_safe_cond_assign( &M, &mm, ! m_is_odd ) );

    /*
     * Go for comb multiplication, R = M * P
     */
    ecp_comb_fixed( k, d, w, &M );
    MBEDTLS_MPI_CHK( ecp_mul_comb_core( grp, R, T, pre_len, k, d, f_rng, p_rng ) );

    /*
     * Now get m * P from M * P and normalize it
     */
    MBEDTLS_MPI_CHK( ecp_safe_invert_jac( grp, R, ! m_is_odd ) );
    MBEDTLS_MPI_CHK( ecp_normalize_jac( grp, R ) );

cleanup:

    if( T != NULL && ! p_eq_g )
    {
        for( i = 0; i < pre_len; i++ )
            mbedtls_ecp_point_free( &T[i] );
        mbedtls_free( T );
    }

    mbedtls_mpi_free( &M );
    mbedtls_mpi_free( &mm );

    if( ret != 0 )
        mbedtls_ecp_point_free( R );

    return( ret );
}